

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O2

void outputClausesToLaTeX(Problem *prb)

{
  int iVar1;
  ostream *poVar2;
  ImmediateSimplificationEngine *pIVar3;
  undefined4 extraout_var;
  Clause *u;
  uint index;
  LaTeX latex;
  ClauseIterator cit;
  CompositeISE simplifier;
  string local_240;
  ofstream latexOut;
  
  std::__cxx11::string::string((string *)&simplifier,(string *)(Lib::env + 0x6a70));
  std::ofstream::ofstream
            (&latexOut,
             (char *)simplifier.super_ImmediateSimplificationEngine.super_InferenceEngine.
                     _vptr_InferenceEngine,_S_out);
  std::__cxx11::string::~string((string *)&simplifier);
  Shell::LaTeX::header_abi_cxx11_((string *)&simplifier,&latex);
  poVar2 = std::operator<<((ostream *)&latexOut,(string *)&simplifier);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&simplifier);
  poVar2 = std::operator<<((ostream *)&latexOut,"\\section{Problem ");
  poVar2 = std::operator<<(poVar2,(string *)(Lib::env + 0x82d8));
  poVar2 = std::operator<<(poVar2,"}");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&latexOut,"\\[\n\\begin{array}{ll}");
  std::endl<char,std::char_traits<char>>(poVar2);
  simplifier.super_ImmediateSimplificationEngine.super_InferenceEngine._salg =
       (SaturationAlgorithm *)0x0;
  simplifier.super_ImmediateSimplificationEngine.super_InferenceEngine._vptr_InferenceEngine =
       (_func_int **)&PTR__CompositeISE_009fb8e0;
  simplifier._inners = (ISList *)0x0;
  simplifier._innersMany = (ISList *)0x0;
  pIVar3 = (ImmediateSimplificationEngine *)operator_new(0x10);
  (pIVar3->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar3->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar3->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_009fbc00;
  Inferences::CompositeISE::addFront(&simplifier,pIVar3);
  pIVar3 = (ImmediateSimplificationEngine *)operator_new(0x18);
  (pIVar3->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar3->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_009fc970;
  *(undefined1 *)&pIVar3[1].super_InferenceEngine._vptr_InferenceEngine = 1;
  Inferences::CompositeISE::addFront(&simplifier,pIVar3);
  pIVar3 = (ImmediateSimplificationEngine *)operator_new(0x10);
  (pIVar3->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar3->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar3->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_009fbb40;
  Inferences::CompositeISE::addFront(&simplifier,pIVar3);
  Kernel::Problem::clauseIterator((Problem *)&cit);
  index = 0;
  while( true ) {
    iVar1 = (*(cit._core)->_vptr_IteratorCore[2])();
    if ((char)iVar1 == '\0') break;
    iVar1 = (*(cit._core)->_vptr_IteratorCore[3])();
    u = Inferences::CompositeISE::simplify(&simplifier,(Clause *)CONCAT44(extraout_var,iVar1));
    if (u != (Clause *)0x0) {
      outputUnitToLaTeX(&latex,&latexOut,&u->super_Unit,index);
      index = index + 1;
    }
  }
  poVar2 = std::operator<<((ostream *)&latexOut,"\\end{array}\n\\]");
  Shell::LaTeX::footer_abi_cxx11_(&local_240,&latex);
  poVar2 = std::operator<<(poVar2,(string *)&local_240);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_240);
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&cit);
  Inferences::CompositeISE::~CompositeISE(&simplifier);
  std::ofstream::~ofstream(&latexOut);
  return;
}

Assistant:

void outputClausesToLaTeX(Problem* prb)
{
  ASS(env.options->latexOutput()!="off");

  LaTeX latex;
  ofstream latexOut(env.options->latexOutput().c_str());
  latexOut << latex.header() << endl;
  latexOut << "\\section{Problem "<<env.options->problemName() << "}" << endl;
  //TODO output more header
  latexOut << "\\[\n\\begin{array}{ll}" << endl;

  CompositeISE simplifier;
  simplifier.addFront(new TrivialInequalitiesRemovalISE());
  simplifier.addFront(new TautologyDeletionISE());
  simplifier.addFront(new DuplicateLiteralRemovalISE());

  unsigned index=0;
  ClauseIterator cit = prb->clauseIterator();
  while (cit.hasNext()) {
    Clause* cl = cit.next();
    cl = simplifier.simplify(cl);
    if (!cl) {
      continue;
    }
    outputUnitToLaTeX(latex,latexOut,cl,index++);
  }
  latexOut  << "\\end{array}\n\\]" << latex.footer() << "\n";

  //close ofstream?
}